

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.hpp
# Opt level: O0

type jsoncons::detail::to_integer_unchecked<long,char>(char *s,size_t length,long *n)

{
  char cVar1;
  string *s_00;
  long *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar2;
  long in_RSI;
  char *in_RDI;
  type tVar3;
  long x_1;
  long x;
  char *end;
  assertion_error *this;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *local_18;
  to_integer_result<long,_char> local_10;
  
  if (in_RSI == 0) {
    s_00 = (string *)__cxa_allocate_exception(0x10);
    this = (assertion_error *)&stack0xffffffffffffffb7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    assertion_error::assertion_error(this,s_00);
    __cxa_throw(s_00,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  *in_RDX = 0;
  local_18 = in_RDI;
  if (*in_RDI == '-') {
    for (local_18 = in_RDI + 1; local_18 < in_RDI + in_RSI; local_18 = local_18 + 1) {
      cVar1 = *local_18;
      if (*in_RDX < -0xccccccccccccccc) {
        to_integer_result<long,_char>::to_integer_result(&local_10,local_18,overflow);
        uVar2 = extraout_RDX;
        goto LAB_001dcd05;
      }
      *in_RDX = *in_RDX * 10;
      if (*in_RDX < (long)cVar1 + 0x7fffffffffffffd0) {
        to_integer_result<long,_char>::to_integer_result(&local_10,local_18,overflow);
        uVar2 = extraout_RDX_00;
        goto LAB_001dcd05;
      }
      *in_RDX = *in_RDX - ((long)cVar1 + -0x30);
    }
  }
  else {
    for (; local_18 < in_RDI + in_RSI; local_18 = local_18 + 1) {
      cVar1 = *local_18;
      if (0xccccccccccccccc < *in_RDX) {
        to_integer_result<long,_char>::to_integer_result(&local_10,local_18,overflow);
        uVar2 = extraout_RDX_01;
        goto LAB_001dcd05;
      }
      *in_RDX = *in_RDX * 10;
      if (0x7fffffffffffffff - ((long)cVar1 + -0x30) < *in_RDX) {
        to_integer_result<long,_char>::to_integer_result(&local_10,local_18,overflow);
        uVar2 = extraout_RDX_02;
        goto LAB_001dcd05;
      }
      *in_RDX = (long)cVar1 + -0x30 + *in_RDX;
    }
  }
  to_integer_result<long,_char>::to_integer_result(&local_10,local_18,success);
  uVar2 = extraout_RDX_03;
LAB_001dcd05:
  tVar3._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  tVar3.ec = local_10.ec;
  tVar3.ptr = local_10.ptr;
  return tVar3;
}

Assistant:

typename std::enable_if<ext_traits::integer_limits<T>::is_specialized && ext_traits::integer_limits<T>::is_signed,to_integer_result<T,CharT>>::type
to_integer_unchecked(const CharT* s, std::size_t length, T& n)
{
    static_assert(ext_traits::integer_limits<T>::is_specialized, "Integer type not specialized");
    JSONCONS_ASSERT(length > 0);

    n = 0;

    const CharT* end = s + length; 
    if (*s == '-')
    {
        static constexpr T min_value = (ext_traits::integer_limits<T>::lowest)();
        static constexpr T min_value_div_10 = min_value / 10;
        ++s;
        for (; s < end; ++s)
        {
            T x = (T)*s - (T)('0');
            if (n < min_value_div_10)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n = n * 10;
            if (n < min_value + x)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }

            n -= x;
        }
    }
    else
    {
        static constexpr T max_value = (ext_traits::integer_limits<T>::max)();
        static constexpr T max_value_div_10 = max_value / 10;
        for (; s < end; ++s)
        {
            T x = static_cast<T>(*s) - static_cast<T>('0');
            if (n > max_value_div_10)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n = n * 10;
            if (n > max_value - x)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }

            n += x;
        }
    }

    return to_integer_result<T,CharT>(s, to_integer_errc());
}